

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

int Abc_AigNodeHasComplFanoutEdgeTrav(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *p;
  int local_24;
  int iFanin;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode_local;
  
  local_24 = 0;
  do {
    iVar1 = Abc_ObjFanoutNum(pNode);
    if (iVar1 <= local_24) {
      return 0;
    }
    p = Abc_ObjFanout(pNode,local_24);
    iVar1 = Abc_NodeIsTravIdCurrent(p);
    if (iVar1 != 0) {
      iVar1 = Vec_IntFind(&p->vFanins,pNode->Id);
      if (iVar1 < 0) {
        __assert_fail("iFanin >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                      ,0x4ec,"int Abc_AigNodeHasComplFanoutEdgeTrav(Abc_Obj_t *)");
      }
      iVar1 = Abc_ObjFaninC(p,iVar1);
      if (iVar1 != 0) {
        return 1;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int Abc_AigNodeHasComplFanoutEdgeTrav( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i, iFanin;
    Abc_ObjForEachFanout( pNode, pFanout, i )
    {
        if ( !Abc_NodeIsTravIdCurrent(pFanout) )
            continue;
        iFanin = Vec_IntFind( &pFanout->vFanins, pNode->Id );
        assert( iFanin >= 0 );
        if ( Abc_ObjFaninC( pFanout, iFanin ) )
            return 1;
    }
    return 0;
}